

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O1

arrayMoveList * __thiscall
game::generateLegalMoves(arrayMoveList *__return_storage_ptr__,game *this)

{
  bool bVar1;
  bool bVar2;
  byte bVar4;
  move mVar3;
  move moveMade;
  long lVar5;
  game *pgVar6;
  U64 *pUVar7;
  uint3 uVar8;
  byte bVar9;
  arrayMoveList moves;
  bitboards in_stack_fffffffffffffc68;
  arrayMoveList local_330;
  
  bVar9 = 0;
  generateSemilegalMoves(&local_330,this);
  memset(__return_storage_ptr__,0,0x304);
  __return_storage_ptr__->iteratorCount = -1;
  arrayMoveList::resetIterator(&local_330);
  bVar1 = arrayMoveList::next(&local_330);
  if (bVar1) {
    do {
      mVar3 = arrayMoveList::getMove(&local_330);
      moveMade = arrayMoveList::getMove(&local_330);
      makeMove(this,moveMade);
      bVar1 = isGameLegal(this);
      if (((uint3)mVar3 & 0xff0000) == 0x10000) {
        undoMove(this);
        bVar2 = this->blacksTurn;
        pgVar6 = this;
        pUVar7 = (U64 *)&stack0xfffffffffffffc68;
        for (lVar5 = 0xd; lVar5 != 0; lVar5 = lVar5 + -1) {
          *pUVar7 = (pgVar6->boards).WP;
          pgVar6 = (game *)((long)pgVar6 + (ulong)bVar9 * -0x10 + 8);
          pUVar7 = pUVar7 + (ulong)bVar9 * -2 + 1;
        }
        bVar2 = inCheck(bVar2,in_stack_fffffffffffffc68);
        bVar1 = bVar1 && !bVar2;
        mVar3 = arrayMoveList::getMove(&local_330);
        bVar4 = mVar3.end;
        if (bVar4 < 0x3a) {
          if (bVar4 == 2) {
            uVar8 = 0x300;
            goto LAB_00103974;
          }
          if (bVar4 == 6) {
            uVar8 = 0x500;
            goto LAB_00103974;
          }
        }
        else {
          if (bVar4 == 0x3a) {
            uVar8 = 0x3b00;
          }
          else {
            if (bVar4 != 0x3e) goto LAB_0010399d;
            uVar8 = 0x3d00;
          }
LAB_00103974:
          mVar3 = arrayMoveList::getMove(&local_330);
          makeMove(this,(move)((uint3)mVar3 & 0xff | uVar8));
          bVar2 = isGameLegal(this);
          bVar1 = bVar1 && bVar2;
          undoMove(this);
        }
LAB_0010399d:
        if (bVar1) {
          mVar3 = arrayMoveList::getMove(&local_330);
          arrayMoveList::add(__return_storage_ptr__,mVar3);
        }
      }
      else {
        if (bVar1) {
          mVar3 = arrayMoveList::getMove(&local_330);
          arrayMoveList::add(__return_storage_ptr__,mVar3);
        }
        undoMove(this);
      }
      bVar1 = arrayMoveList::next(&local_330);
    } while (bVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

arrayMoveList game::generateLegalMoves() {
    arrayMoveList moves = generateSemilegalMoves();
    arrayMoveList returnedMoves;

    moves.resetIterator();
    while(moves.next()) {
        if(moves.getMove().special == 1) { // Are castling kings put in check en route?
            bool good = true;
            makeMove(moves.getMove());
            if(!isGameLegal()) good = false;
            undoMove();

            if(inCheck(blacksTurn, boards)) good = false;

            move intermediate;
            switch (moves.getMove().end) {
                case 2:
                    intermediate.start = moves.getMove().start;
                    intermediate.end = 3;
                    makeMove(intermediate);
                    if(!isGameLegal()) good = false;
                    undoMove();
                    break;
                case 6:
                    intermediate.start = moves.getMove().start;
                    intermediate.end = 5;
                    makeMove(intermediate);
                    if(!isGameLegal()) good = false;
                    undoMove();
                    break;
                case 58:
                    intermediate.start = moves.getMove().start;
                    intermediate.end = 59;
                    makeMove(intermediate);
                    if(!isGameLegal()) good = false;
                    undoMove();
                    break;
                case 62:
                    intermediate.start = moves.getMove().start;
                    intermediate.end = 61;
                    makeMove(intermediate);
                    if(!isGameLegal()) good = false;
                    undoMove();
                    break;
            }
            if(good) returnedMoves.add(moves.getMove());
        } else {
            makeMove(moves.getMove());
            if(isGameLegal()) returnedMoves.add(moves.getMove());
            undoMove();
        }
    }
    return returnedMoves;
}